

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmapbuilder.cpp
# Opt level: O3

png_bytepp readPngFile(string *path,int *rowBytes,int *width,int *height)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  long lVar3;
  __jmp_buf_tag *__env;
  png_bytepp pppVar4;
  png_byte *ppVar5;
  size_type *psVar6;
  runtime_error *prVar7;
  long *plVar8;
  long lVar9;
  png_structp png;
  png_infop pngInfo;
  uchar header [8];
  long local_a8;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long local_60;
  undefined1 local_58 [8];
  string local_50;
  
  __stream = fopen((path->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Couldn\'t open %s for reading!\n","");
    formatString<char_const*>(&local_a0,&local_50,(path->_M_dataplus)._M_p);
    std::runtime_error::runtime_error(prVar7,(string *)&local_a0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar2 = fread(local_58,1,8,__stream);
  if (sVar2 != 8) {
    fclose(__stream);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_80,"Error in reading ",path);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_a0._M_dataplus._M_p = (pointer)*plVar8;
    psVar6 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0.field_2._8_8_ = plVar8[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar6;
    }
    local_a0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar6;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::runtime_error::runtime_error(prVar7,(string *)&local_a0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = png_sig_cmp(local_58,0,8);
  if (iVar1 != 0) {
    fclose(__stream);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_80,"Error in reading ",path);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_a0._M_dataplus._M_p = (pointer)*plVar8;
    psVar6 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0.field_2._8_8_ = plVar8[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar6;
    }
    local_a0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar6;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::runtime_error::runtime_error(prVar7,(string *)&local_a0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a8 = png_create_read_struct("1.6.37",0,0);
  if (local_a8 != 0) {
    lVar3 = png_create_info_struct(local_a8);
    local_60 = lVar3;
    if (lVar3 == 0) {
      fclose(__stream);
      png_destroy_read_struct(&local_a8,0);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_80,"Error in libpng for ",path);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
      local_a0._M_dataplus._M_p = (pointer)*plVar8;
      psVar6 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
        local_a0.field_2._M_allocated_capacity = *psVar6;
        local_a0.field_2._8_8_ = plVar8[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar6;
      }
      local_a0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar6;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::runtime_error::runtime_error(prVar7,(string *)&local_a0);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_a8,longjmp,200);
    iVar1 = _setjmp(__env);
    if (iVar1 == 0) {
      png_init_io(local_a8,__stream);
      png_set_sig_bytes(local_a8,8);
      png_read_info(local_a8,lVar3);
      if (width != (int *)0x0) {
        iVar1 = png_get_image_width(local_a8,lVar3);
        *width = iVar1;
      }
      if (height != (int *)0x0) {
        iVar1 = png_get_image_height(local_a8,lVar3);
        *height = iVar1;
      }
      if (rowBytes != (int *)0x0) {
        iVar1 = png_get_rowbytes(local_a8,lVar3);
        *rowBytes = iVar1;
      }
      lVar3 = (long)*height;
      pppVar4 = (png_bytepp)malloc(lVar3 * 8);
      if (0 < lVar3) {
        iVar1 = *rowBytes;
        lVar9 = 0;
        do {
          ppVar5 = (png_byte *)malloc((long)iVar1);
          pppVar4[lVar9] = ppVar5;
          lVar9 = lVar9 + 1;
        } while (lVar3 != lVar9);
      }
      png_read_image(local_a8,pppVar4);
      png_destroy_read_struct(&local_a8,&local_60,0);
      fclose(__stream);
      return pppVar4;
    }
    fclose(__stream);
    png_destroy_read_struct(&local_a8,0);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_80,"Error in libpng for ",path);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_a0._M_dataplus._M_p = (pointer)*plVar8;
    psVar6 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0.field_2._8_8_ = plVar8[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar6;
    }
    local_a0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar6;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::runtime_error::runtime_error(prVar7,(string *)&local_a0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fclose(__stream);
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_80,"Error in libpng for ",path);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_a0._M_dataplus._M_p = (pointer)*plVar8;
  psVar6 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
    local_a0.field_2._M_allocated_capacity = *psVar6;
    local_a0.field_2._8_8_ = plVar8[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar6;
  }
  local_a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar6;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::runtime_error::runtime_error(prVar7,(string *)&local_a0);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

png_bytepp readPngFile(std::string path, int *rowBytes, int *width, int*height){
    unsigned char header[8];
    FILE *file = fopen(path.c_str(),"rb");
    if (file == nullptr)
        throw CANT_READ(path.c_str());

    const int cmpNum = 8;
    if( fread(header,1,cmpNum,file) != cmpNum){
        fclose(file);
        throw std::runtime_error("Error in reading "+path+": png is wayyy to small lmao!\n");
    }
    if (png_sig_cmp(header,0,cmpNum) != 0){
        fclose(file);
        throw std::runtime_error("Error in reading "+path+": this is not a valid png!\n");
    }

    png_structp png = png_create_read_struct(PNG_LIBPNG_VER_STRING,NULL,NULL,NULL);
    if (png == NULL){
        fclose(file);
        throw std::runtime_error("Error in libpng for "+path+"!\n");
    }

    png_infop pngInfo = png_create_info_struct(png);
    if (pngInfo == nullptr){
        fclose(file);
        png_destroy_read_struct(&png, NULL ,NULL);
        throw std::runtime_error("Error in libpng for "+path+"!\n");
    }

    if (setjmp(png_jmpbuf(png))){
        fclose(file);
        png_destroy_read_struct(&png, NULL ,NULL);
        throw std::runtime_error("Error in libpng for "+path+"!\n");
    }

    png_init_io(png,file);
    png_set_sig_bytes(png, cmpNum);
    png_read_info(png,pngInfo);
    if(width != nullptr)
        *width = png_get_image_width(png, pngInfo);
    if (height != nullptr)
        *height = png_get_image_height(png, pngInfo);
    if (rowBytes != nullptr)
        *rowBytes = png_get_rowbytes(png, pngInfo);

    png_bytepp rows = (png_bytepp)malloc(sizeof(png_bytep) * *height);
    for(int y=0;y< *height;y++)
        rows[y] = (png_bytep)malloc(*rowBytes);
    png_read_image(png,rows);
    png_destroy_read_struct(&png, &pngInfo, NULL);

    fclose(file);
    return rows;
}